

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::htmlCodeReplacement(string *unit_string)

{
  ulong uVar1;
  undefined8 local_18;
  size_type fnd;
  string *unit_string_local;
  
  local_18 = std::__cxx11::string::find((char *)unit_string,0x1c2081);
  while (local_18 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)unit_string,local_18,(char *)0x5);
    uVar1 = std::__cxx11::string::find((char *)unit_string,0x1c2087);
    if (uVar1 == 0xffffffffffffffff) {
      uVar1 = std::__cxx11::string::find((char *)unit_string,0x1c208e);
      if (uVar1 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)unit_string,uVar1,(char *)0x8);
      }
    }
    else {
      std::__cxx11::string::replace((ulong)unit_string,uVar1,(char *)0x6);
    }
    local_18 = std::__cxx11::string::find((char *)unit_string,0x1c2081);
  }
  local_18 = std::__cxx11::string::find((char *)unit_string,0x1c2096);
  while (local_18 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)unit_string,local_18,(char *)0x5);
    uVar1 = std::__cxx11::string::find((char *)unit_string,0x1c209c);
    if (uVar1 == 0xffffffffffffffff) {
      uVar1 = std::__cxx11::string::find((char *)unit_string,0x1c20a3);
      if (uVar1 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)unit_string,uVar1,(char *)0x8);
      }
    }
    else {
      std::__cxx11::string::replace((ulong)unit_string,uVar1,(char *)0x6);
    }
    local_18 = std::__cxx11::string::find((char *)unit_string,0x1c2096);
  }
  return;
}

Assistant:

static void htmlCodeReplacement(std::string& unit_string)
{
    auto fnd = unit_string.find("<sup>");
    while (fnd != std::string::npos) {
        unit_string.replace(fnd, 5, "^");
        fnd = unit_string.find("</sup>");
        if (fnd != std::string::npos) {
            unit_string.replace(fnd, 6, "");
        } else {
            fnd = unit_string.find("<\\/sup>");
            if (fnd != std::string::npos) {
                unit_string.replace(fnd, 8, "");
            }
        }
        fnd = unit_string.find("<sup>");
    }
    fnd = unit_string.find("<sub>");
    while (fnd != std::string::npos) {
        unit_string.replace(fnd, 5, "_");
        fnd = unit_string.find("</sub>");
        if (fnd != std::string::npos) {
            unit_string.replace(fnd, 6, "");
        } else {
            fnd = unit_string.find("<\\/sub>");
            if (fnd != std::string::npos) {
                unit_string.replace(fnd, 8, "");
            }
        }
        fnd = unit_string.find("<sub>");
    }
}